

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_settings.hpp
# Opt level: O2

void __thiscall
libtorrent::aux::session_settings::set_int(session_settings *this,int name,int value)

{
  unique_lock<std::mutex> l;
  unique_lock<std::mutex> uStack_28;
  
  ::std::unique_lock<std::mutex>::unique_lock(&uStack_28,&this->m_mutex);
  if ((name & 0xc000U) == 0x4000) {
    (this->m_store).m_ints._M_elems[name & 0x3fff] = value;
  }
  ::std::unique_lock<std::mutex>::~unique_lock(&uStack_28);
  return;
}

Assistant:

void set_int(int name, int value) override
		{
			std::unique_lock<std::mutex> l(m_mutex);
			m_store.set_int(name, value);
		}